

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLElement::~XMLElement(XMLElement *this)

{
  XMLAttribute *pXVar1;
  XMLAttribute *attribute;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_002757e0;
  attribute = this->_rootAttribute;
  while (attribute != (XMLAttribute *)0x0) {
    pXVar1 = attribute->_next;
    DeleteAttribute(attribute);
    this->_rootAttribute = pXVar1;
    attribute = pXVar1;
  }
  XMLComment::~XMLComment((XMLComment *)this);
  return;
}

Assistant:

XMLElement::~XMLElement()
{
    while( _rootAttribute ) {
        XMLAttribute* next = _rootAttribute->_next;
        DeleteAttribute( _rootAttribute );
        _rootAttribute = next;
    }
}